

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O1

Vec_Ptr_t * Sim_ComputeFunSupp(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint *puVar1;
  long lVar2;
  undefined4 uVar3;
  uint *puVar4;
  Abc_Ntk_t *pAVar5;
  long *plVar6;
  void **ppvVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Sim_Man_t *p;
  Vec_Int_t *pVVar11;
  void **ppvVar12;
  undefined8 *puVar13;
  void *pvVar14;
  Vec_Vec_t *pVVar15;
  Abc_Ntk_t *pNtk_00;
  Fraig_Man_t *p_00;
  int *piVar16;
  int *piVar17;
  Vec_Ptr_t *pVVar18;
  Sim_Pat_t *pSVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  timespec ts_1;
  timespec ts;
  timespec local_a0;
  size_t local_90;
  Sim_Man_t *local_88;
  long local_80;
  Sim_Pat_t *local_78;
  Fraig_Params_t local_70;
  
  iVar8 = clock_gettime(3,(timespec *)&local_70);
  if (iVar8 < 0) {
    local_80 = 1;
  }
  else {
    lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_70.nSeconds,local_70.nBTLimit)),8);
    local_80 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_70._0_8_ * -1000000;
  }
  srand(0xabc);
  p = Sim_ManStart(pNtk,0);
  Sim_UtilAssignRandom(p);
  Sim_ComputeSuppRound(p,0);
  pVVar18 = p->pNtk->vCos;
  local_88 = p;
  if (0 < pVVar18->nSize) {
    lVar21 = 0;
    do {
      Sim_UtilInfoDetectNews
                ((uint *)p->vSuppFun->pArray[lVar21],
                 (uint *)p->vSuppStr->pArray[*(int *)((long)pVVar18->pArray[lVar21] + 0x10)],
                 p->nSuppWords,p->vDiffs);
      pVVar11 = p->vDiffs;
      if (0 < pVVar11->nSize) {
        lVar27 = 0;
        do {
          uVar9 = pVVar11->pArray[lVar27];
          pVVar15 = p->vSuppTargs;
          if (pVVar15->nSize <= (int)uVar9) {
            iVar8 = uVar9 + 1;
            if (pVVar15->nCap <= (int)uVar9) {
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar12 = (void **)malloc((long)iVar8 << 3);
              }
              else {
                ppvVar12 = (void **)realloc(pVVar15->pArray,(long)iVar8 << 3);
              }
              pVVar15->pArray = ppvVar12;
              pVVar15->nCap = iVar8;
            }
            iVar23 = pVVar15->nSize;
            lVar26 = (long)iVar23;
            if (iVar23 <= (int)uVar9) {
              iVar23 = (uVar9 - iVar23) + 1;
              do {
                puVar13 = (undefined8 *)malloc(0x10);
                *puVar13 = 0;
                puVar13[1] = 0;
                pVVar15->pArray[lVar26] = puVar13;
                lVar26 = lVar26 + 1;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            pVVar15->nSize = iVar8;
            p = local_88;
          }
          if (((int)uVar9 < 0) || (pVVar15->nSize <= (int)uVar9)) {
LAB_004cce99:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          puVar4 = (uint *)pVVar15->pArray[uVar9];
          uVar9 = *puVar4;
          if (puVar4[1] == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (*(void **)(puVar4 + 2) == (void *)0x0) {
                pvVar14 = malloc(0x80);
              }
              else {
                pvVar14 = realloc(*(void **)(puVar4 + 2),0x80);
              }
              *(void **)(puVar4 + 2) = pvVar14;
              uVar10 = 0x10;
            }
            else {
              uVar10 = uVar9 * 2;
              if ((int)uVar10 <= (int)uVar9) goto LAB_004cc59f;
              if (*(void **)(puVar4 + 2) == (void *)0x0) {
                pvVar14 = malloc((ulong)uVar9 << 4);
              }
              else {
                pvVar14 = realloc(*(void **)(puVar4 + 2),(ulong)uVar9 << 4);
              }
              *(void **)(puVar4 + 2) = pvVar14;
            }
            *puVar4 = uVar10;
          }
LAB_004cc59f:
          uVar9 = puVar4[1];
          puVar4[1] = uVar9 + 1;
          *(long *)(*(long *)(puVar4 + 2) + (long)(int)uVar9 * 8) = lVar21;
          lVar27 = lVar27 + 1;
          pVVar11 = p->vDiffs;
        } while (lVar27 < pVVar11->nSize);
      }
      lVar21 = lVar21 + 1;
      pVVar18 = p->pNtk->vCos;
    } while (lVar21 < pVVar18->nSize);
  }
  if (fVerbose != 0) {
    lVar21 = (long)p->vSuppTargs->nSize;
    if (0 < lVar21) {
      lVar27 = 0;
      do {
        lVar27 = lVar27 + 1;
      } while (lVar21 != lVar27);
    }
    printf("Number of support targets after simulation = %5d.\n");
  }
  lVar21 = (long)p->vSuppTargs->nSize;
  if (0 < lVar21) {
    lVar27 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + *(int *)((long)p->vSuppTargs->pArray[lVar27] + 4);
      lVar27 = lVar27 + 1;
    } while (lVar21 != lVar27);
    if (iVar8 != 0) {
      Sim_UtilAssignRandom(p);
      uVar9 = Sim_ComputeSuppRound(p,1);
      pVVar15 = p->vSuppTargs;
      lVar21 = (long)pVVar15->nSize;
      if (0 < lVar21) {
        lVar27 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + *(int *)((long)pVVar15->pArray[lVar27] + 4);
          lVar27 = lVar27 + 1;
        } while (lVar21 != lVar27);
        if (iVar8 != 0) {
          if (fVerbose != 0) {
            if (pVVar15->nSize < 1) {
              uVar24 = 0;
            }
            else {
              lVar27 = 0;
              uVar24 = 0;
              do {
                uVar24 = (ulong)(uint)((int)uVar24 + *(int *)((long)pVVar15->pArray[lVar27] + 4));
                lVar27 = lVar27 + 1;
              } while (lVar21 != lVar27);
            }
            printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",uVar24,(ulong)uVar9,
                   (ulong)(uint)p->vFifo->nSize);
          }
          pVVar15 = p->vSuppTargs;
          uVar9 = pVVar15->nSize;
          while (0 < (int)uVar9) {
            uVar24 = 0;
            iVar8 = 0;
            do {
              iVar8 = iVar8 + *(int *)((long)pVVar15->pArray[uVar24] + 4);
              uVar24 = uVar24 + 1;
            } while (uVar9 != uVar24);
            if (iVar8 < 1) break;
            p->nSatRuns = 0;
            if (0 < pVVar15->nSize) {
              lVar21 = 0;
              do {
                uVar24 = (ulong)*(uint *)((long)pVVar15->pArray[lVar21] + 4);
                while( true ) {
                  if ((int)uVar24 < 1) break;
                  if (p->vSuppTargs->nSize <= lVar21) goto LAB_004cce99;
                  pvVar14 = p->vSuppTargs->pArray[lVar21];
                  if (*(int *)((long)pvVar14 + 4) < (int)uVar24) {
LAB_004ccef6:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  lVar27 = *(long *)(*(long *)((long)pvVar14 + 8) + -8 + uVar24 * 8);
                  p->nSatRuns = p->nSatRuns + 1;
                  iVar23 = (int)lVar21;
                  uVar9 = (uint)lVar27;
                  pNtk_00 = Abc_NtkMiterForCofactors(p->pNtk,uVar9,iVar23,-1);
                  Fraig_ParamsSetDefault(&local_70);
                  local_70.nSeconds = 1000000000;
                  local_70.fInternal = 1;
                  iVar8 = clock_gettime(3,&local_a0);
                  if (iVar8 < 0) {
                    lVar26 = 1;
                  }
                  else {
                    lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
                    lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + local_a0.tv_sec * -1000000;
                  }
                  p_00 = (Fraig_Man_t *)Abc_NtkToFraig(pNtk_00,&local_70,0,0);
                  iVar8 = clock_gettime(3,&local_a0);
                  if (iVar8 < 0) {
                    lVar22 = -1;
                  }
                  else {
                    lVar22 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
                  }
                  p->timeFraig = p->timeFraig + lVar22 + lVar26;
                  iVar8 = clock_gettime(3,&local_a0);
                  if (iVar8 < 0) {
                    lVar26 = 1;
                  }
                  else {
                    lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
                    lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + local_a0.tv_sec * -1000000;
                  }
                  Fraig_ManProveMiter(p_00);
                  iVar8 = clock_gettime(3,&local_a0);
                  if (iVar8 < 0) {
                    lVar22 = -1;
                  }
                  else {
                    lVar22 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
                  }
                  p->timeSat = p->timeSat + lVar22 + lVar26;
                  iVar8 = Fraig_ManCheckMiter(p_00);
                  if (iVar8 < 0) {
                    __assert_fail("RetValue >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                                  ,0x1e5,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
                  }
                  local_90 = CONCAT44(local_90._4_4_,iVar8);
                  if (iVar8 == 1) {
                    p->nSatRunsUnsat = p->nSatRunsUnsat + 1;
                    pvVar14 = p->vSuppTargs->pArray[lVar21];
                    uVar9 = *(uint *)((long)pvVar14 + 4);
                    lVar26 = (ulong)uVar9 + 1;
                    do {
                      if ((int)lVar26 + -1 < 1) {
                        __assert_fail("i >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                      ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
                      }
                      lVar22 = lVar26 + -1;
                      lVar2 = lVar26 * 8;
                      lVar26 = lVar22;
                    } while (*(long *)(*(long *)((long)pvVar14 + 8) + -0x10 + lVar2) != lVar27);
                    for (; (int)lVar22 < (int)uVar9; lVar22 = lVar22 + 1) {
                      *(undefined8 *)(*(long *)((long)pvVar14 + 8) + -8 + lVar22 * 8) =
                           *(undefined8 *)(*(long *)((long)pvVar14 + 8) + lVar22 * 8);
                    }
                    *(uint *)((long)pvVar14 + 4) = uVar9 - 1;
                  }
                  else {
                    p->nSatRunsSat = p->nSatRunsSat + 1;
                    piVar16 = Fraig_ManReadModel(p_00);
                    if (piVar16 == (int *)0x0) {
                      __assert_fail("pModel != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                                    ,0x1f0,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
                    }
                    pAVar5 = p->pNtk;
                    if ((pAVar5->vTravIds).pArray == (int *)0x0) {
                      iVar8 = pAVar5->vObjs->nSize;
                      uVar20 = (long)iVar8 + 500;
                      iVar25 = (int)uVar20;
                      if ((pAVar5->vTravIds).nCap < iVar25) {
                        piVar17 = (int *)malloc(uVar20 * 4);
                        (pAVar5->vTravIds).pArray = piVar17;
                        if (piVar17 == (int *)0x0) {
                          __assert_fail("p->pArray",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                        }
                        (pAVar5->vTravIds).nCap = iVar25;
                      }
                      if (-500 < iVar8) {
                        memset((pAVar5->vTravIds).pArray,0,(uVar20 & 0xffffffff) << 2);
                      }
                      (pAVar5->vTravIds).nSize = iVar25;
                    }
                    iVar8 = pAVar5->nTravIds;
                    pAVar5->nTravIds = iVar8 + 1;
                    if (0x3ffffffe < iVar8) {
                      __assert_fail("p->nTravIds < (1<<30)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
                    }
                    pVVar18 = pAVar5->vCis;
                    if (0 < pVVar18->nSize) {
                      lVar27 = 0;
                      do {
                        plVar6 = (long *)pVVar18->pArray[lVar27];
                        lVar26 = *plVar6;
                        uVar3 = *(undefined4 *)(lVar26 + 0xd8);
                        iVar8 = (int)plVar6[2];
                        Vec_IntFillExtra((Vec_Int_t *)(lVar26 + 0xe0),iVar8 + 1,uVar9);
                        if (((long)iVar8 < 0) || (*(int *)(lVar26 + 0xe4) <= iVar8)) {
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                        }
                        *(undefined4 *)(*(long *)(lVar26 + 0xe8) + (long)iVar8 * 4) = uVar3;
                        if (pAVar5->vCis->nSize <= lVar21) goto LAB_004ccef6;
                        if (plVar6 == (long *)pAVar5->vCis->pArray[lVar21]) {
                          plVar6[8] = 1;
                        }
                        else if (piVar16[lVar27] == 1) {
                          plVar6[8] = 3;
                        }
                        else {
                          plVar6[8] = 0;
                        }
                        lVar27 = lVar27 + 1;
                        pVVar18 = pAVar5->vCis;
                      } while (lVar27 < pVVar18->nSize);
                    }
                    if (((int)uVar9 < 0) || (pAVar5->vCos->nSize <= (int)uVar9)) goto LAB_004ccef6;
                    plVar6 = (long *)pAVar5->vCos->pArray[uVar9 & 0x7fffffff];
                    uVar10 = Sim_NtkSimTwoPats_rec
                                       (*(Abc_Obj_t **)
                                         (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                         (long)*(int *)plVar6[4] * 8));
                    p = local_88;
                    if ((uVar10 & 3) - 3 < 0xfffffffe) {
                      __assert_fail("Sim_SolveSuppModelVerify( p->pNtk, pModel, Input, Output )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                                    ,0x1f1,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
                    }
                    pSVar19 = Sim_ManPatAlloc(local_88);
                    pSVar19->Input = iVar23;
                    pSVar19->Output = uVar9;
                    pVVar18 = p->pNtk->vCis;
                    if (0 < pVVar18->nSize) {
                      uVar20 = 0;
                      do {
                        if (piVar16[uVar20] != 0) {
                          pSVar19->pData[uVar20 >> 5 & 0x7ffffff] =
                               pSVar19->pData[uVar20 >> 5 & 0x7ffffff] | 1 << ((byte)uVar20 & 0x1f);
                        }
                        uVar20 = uVar20 + 1;
                      } while ((long)uVar20 < (long)pVVar18->nSize);
                    }
                    pVVar18 = p->vFifo;
                    uVar9 = pVVar18->nCap;
                    if (pVVar18->nSize == uVar9) {
                      if ((int)uVar9 < 0x10) {
                        if (pVVar18->pArray == (void **)0x0) {
                          ppvVar12 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar12 = (void **)realloc(pVVar18->pArray,0x80);
                        }
                        pVVar18->pArray = ppvVar12;
                        iVar8 = 0x10;
                      }
                      else {
                        iVar8 = uVar9 * 2;
                        if (iVar8 <= (int)uVar9) goto LAB_004ccbf2;
                        if (pVVar18->pArray == (void **)0x0) {
                          ppvVar12 = (void **)malloc((ulong)uVar9 << 4);
                        }
                        else {
                          ppvVar12 = (void **)realloc(pVVar18->pArray,(ulong)uVar9 << 4);
                        }
                        pVVar18->pArray = ppvVar12;
                      }
                      pVVar18->nCap = iVar8;
                    }
LAB_004ccbf2:
                    iVar8 = pVVar18->nSize;
                    pVVar18->nSize = iVar8 + 1;
                    pVVar18->pArray[iVar8] = pSVar19;
                  }
                  uVar24 = uVar24 - 1;
                  Fraig_ManFree(p_00);
                  Abc_NtkDelete(pNtk_00);
                  p->iInput = iVar23;
                  if ((int)local_90 != 1) goto LAB_004ccc63;
                }
                lVar21 = lVar21 + 1;
                pVVar15 = p->vSuppTargs;
              } while (lVar21 < pVVar15->nSize);
            }
LAB_004ccc63:
            uVar9 = 0;
            do {
              pVVar18 = p->vFifo;
              if (pVVar18->nSize < 1) break;
              uVar10 = pVVar18->nSize - 1;
              pVVar18->nSize = uVar10;
              local_78 = (Sim_Pat_t *)pVVar18->pArray[uVar10];
              uVar10 = p->nSuppWords + uVar9;
              if (p->nSimWords <= (int)uVar10) {
                uVar10 = p->nSimWords;
              }
              pVVar18 = p->pNtk->vCis;
              if (0 < pVVar18->nSize) {
                ppvVar12 = pVVar18->pArray;
                ppvVar7 = local_88->vSim0->pArray;
                puVar4 = local_78->pData;
                local_90 = (ulong)(~uVar9 + uVar10) * 4 + 4;
                uVar24 = 0;
                do {
                  pvVar14 = ppvVar7[*(int *)((long)ppvVar12[uVar24] + 0x10)];
                  uVar20 = uVar24 >> 5 & 0x7ffffff;
                  if ((puVar4[uVar20] >> ((uint)uVar24 & 0x1f) & 1) == 0) {
                    if ((int)uVar9 < (int)uVar10) {
                      iVar8 = 0;
                      goto LAB_004ccd4b;
                    }
                  }
                  else if ((int)uVar9 < (int)uVar10) {
                    iVar8 = 0xff;
LAB_004ccd4b:
                    memset((void *)((long)pvVar14 + (long)(int)uVar9 * 4),iVar8,local_90);
                  }
                  puVar1 = (uint *)((long)pvVar14 + uVar20 * 4 + (long)(int)uVar9 * 4);
                  *puVar1 = *puVar1 ^ 1 << ((byte)uVar24 & 0x1f);
                  uVar24 = uVar24 + 1;
                } while ((long)uVar24 < (long)pVVar18->nSize);
              }
              p = local_88;
              Sim_ManPatFree(local_88,local_78);
              uVar9 = uVar10;
            } while (uVar10 != p->nSimWords);
            uVar9 = Sim_ComputeSuppRound(p,1);
            if (fVerbose != 0) {
              lVar21 = (long)p->vSuppTargs->nSize;
              if (lVar21 < 1) {
                uVar24 = 0;
              }
              else {
                lVar27 = 0;
                uVar24 = 0;
                do {
                  uVar24 = (ulong)(uint)((int)uVar24 +
                                        *(int *)((long)p->vSuppTargs->pArray[lVar27] + 4));
                  lVar27 = lVar27 + 1;
                } while (lVar21 != lVar27);
              }
              printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n",uVar24,
                     (ulong)uVar9,(ulong)(uint)p->vFifo->nSize);
            }
            pVVar15 = p->vSuppTargs;
            uVar9 = pVVar15->nSize;
          }
        }
      }
    }
  }
  iVar8 = clock_gettime(3,(timespec *)&local_70);
  if (iVar8 < 0) {
    lVar21 = -1;
  }
  else {
    lVar21 = CONCAT44(local_70.nSeconds,local_70.nBTLimit) / 1000 + local_70._0_8_ * 1000000;
  }
  p->timeTotal = lVar21 + local_80;
  pVVar18 = p->vSuppFun;
  Sim_ManStop(p);
  return pVVar18;
}

Assistant:

Vec_Ptr_t * Sim_ComputeFunSupp( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sim_Man_t * p;
    Vec_Ptr_t * vResult;
    int nSolved, i;
    abctime clk = Abc_Clock();

    srand( 0xABC );

    // start the simulation manager
    p = Sim_ManStart( pNtk, 0 );

    // compute functional support using one round of random simulation
    Sim_UtilAssignRandom( p );
    Sim_ComputeSuppRound( p, 0 );

    // set the support targets 
    Sim_ComputeSuppSetTargets( p );
    if ( fVerbose )
        printf( "Number of support targets after simulation = %5d.\n", Vec_VecSizeSize(p->vSuppTargs) );
    if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
        goto exit;

    for ( i = 0; i < 1; i++ )
    {
        // compute patterns using one round of random simulation
        Sim_UtilAssignRandom( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );
        if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
            goto exit;

        if ( fVerbose )
            printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",
                Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo) );
    }

    // try to solve the support targets
    while ( Vec_VecSizeSize(p->vSuppTargs) > 0 )
    {
        // solve targets until the first disproved one (which gives counter-example)
        Sim_SolveTargetsUsingSat( p, p->nSimWords/p->nSuppWords );
        // compute additional functional support
        Sim_UtilAssignFromFifo( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );

if ( fVerbose )
    printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n", 
            Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo), p->nSatRuns );
    }

exit:
p->timeTotal = Abc_Clock() - clk;
    vResult = p->vSuppFun;  
    //  p->vSuppFun = NULL;
    Sim_ManStop( p );
    return vResult;
}